

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool wallet::RunWithinTxn
               (WalletBatch *batch,string_view process_desc,
               function<bool_(wallet::WalletBatch_&)> *func)

{
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  bool bVar1;
  size_t in_RDX;
  ConstevalFormatString<1U> in_RSI;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  Level in_stack_000000e0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_000000f0;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  WalletBatch *in_stack_ffffffffffffff40;
  function<bool_(wallet::WalletBatch_&)> *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff58;
  bool local_79;
  LogFlags in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  char *pcVar2;
  
  pcVar2 = *(char **)(in_FS_OFFSET + 0x28);
  bVar1 = WalletBatch::TxnBegin
                    ((WalletBatch *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (bVar1) {
    bVar1 = std::function<bool_(wallet::WalletBatch_&)>::operator()
                      (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    if (bVar1) {
      bVar1 = WalletBatch::TxnCommit
                        ((WalletBatch *)
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (bVar1) {
        local_79 = true;
      }
      else {
        bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                    Trace);
        if (bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff58,
                     (char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff58,
                     (char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
          source_file_01._M_str = pcVar2;
          source_file_01._M_len = in_RDX;
          LogPrintFormatInternal<std::basic_string_view<char,std::char_traits<char>>>
                    (in_stack_00000000,source_file_01,in_stack_ffffffffffffffac,
                     in_stack_ffffffffffffffa0,in_stack_000000e0,in_RSI,in_stack_000000f0);
        }
        local_79 = false;
      }
    }
    else {
      bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                  Trace);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffff58,
                   (char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffff58,
                   (char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
        in_stack_ffffffffffffff38 = 1;
        source_file_00._M_str = pcVar2;
        source_file_00._M_len = in_RDX;
        LogPrintFormatInternal<std::basic_string_view<char,std::char_traits<char>>>
                  (in_stack_00000000,source_file_00,in_stack_ffffffffffffffac,
                   in_stack_ffffffffffffffa0,in_stack_000000e0,in_RSI,in_stack_000000f0);
      }
      WalletBatch::TxnAbort
                ((WalletBatch *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      local_79 = false;
    }
  }
  else {
    bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),Trace)
    ;
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff58,
                 (char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff58,
                 (char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      source_file._M_str = pcVar2;
      source_file._M_len = in_RDX;
      LogPrintFormatInternal<std::basic_string_view<char,std::char_traits<char>>>
                (in_stack_00000000,source_file,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
                 in_stack_000000e0,in_RSI,in_stack_000000f0);
    }
    local_79 = false;
  }
  if (*(char **)(in_FS_OFFSET + 0x28) != pcVar2) {
    __stack_chk_fail();
  }
  return local_79;
}

Assistant:

static bool RunWithinTxn(WalletBatch& batch, std::string_view process_desc, const std::function<bool(WalletBatch&)>& func)
{
    if (!batch.TxnBegin()) {
        LogDebug(BCLog::WALLETDB, "Error: cannot create db txn for %s\n", process_desc);
        return false;
    }

    // Run procedure
    if (!func(batch)) {
        LogDebug(BCLog::WALLETDB, "Error: %s failed\n", process_desc);
        batch.TxnAbort();
        return false;
    }

    if (!batch.TxnCommit()) {
        LogDebug(BCLog::WALLETDB, "Error: cannot commit db txn for %s\n", process_desc);
        return false;
    }

    // All good
    return true;
}